

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_lib.cc
# Opt level: O3

bool bssl::dtls1_new(SSL *ssl)

{
  _Head_base<0UL,_bssl::DTLS1_STATE_*,_false> _Var1;
  bool bVar2;
  UniquePtr<DTLS1_STATE> d1;
  _Head_base<0UL,_bssl::DTLS1_STATE_*,_false> local_10;
  
  bVar2 = tls_new(ssl);
  if (bVar2) {
    local_10._M_head_impl = New<bssl::DTLS1_STATE>();
    if ((local_10._M_head_impl == (DTLS1_STATE *)0x0) ||
       (bVar2 = DTLS1_STATE::Init(local_10._M_head_impl), _Var1._M_head_impl = local_10._M_head_impl
       , !bVar2)) {
      tls_free(ssl);
      bVar2 = false;
    }
    else {
      local_10._M_head_impl = (DTLS1_STATE *)0x0;
      ssl->d1 = _Var1._M_head_impl;
      bVar2 = true;
    }
    std::unique_ptr<bssl::DTLS1_STATE,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bssl::DTLS1_STATE,_bssl::internal::Deleter> *)&local_10);
    return bVar2;
  }
  return false;
}

Assistant:

bool dtls1_new(SSL *ssl) {
  if (!tls_new(ssl)) {
    return false;
  }
  UniquePtr<DTLS1_STATE> d1 = MakeUnique<DTLS1_STATE>();
  if (!d1 || !d1->Init()) {
    tls_free(ssl);
    return false;
  }

  ssl->d1 = d1.release();
  return true;
}